

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O0

void crnlib::crnlib_delete_array<unsigned_int>(uint *p)

{
  uint32 num_check;
  uint32 num;
  uint *p_local;
  
  if ((p != (uint *)0x0) && (p[-1] == (p[-2] ^ 0xffffffff))) {
    crnlib_free(p + -4);
  }
  return;
}

Assistant:

inline void crnlib_delete_array(T* p)
    {
        if (p)
        {
            const uint32 num = reinterpret_cast<uint32*>(p)[-1];
            const uint32 num_check = reinterpret_cast<uint32*>(p)[-2];
            CRNLIB_ASSERT(num && (num == ~num_check));
            if (num == ~num_check)
            {
                if (!CRNLIB_IS_SCALAR_TYPE(T))
                {
                    helpers::destruct_array(p, num);
                }

                crnlib_free(reinterpret_cast<uint8*>(p) - CRNLIB_MIN_ALLOC_ALIGNMENT);
            }
        }
    }